

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O1

void __thiscall
FluxTrackBuilder::FluxTrackBuilder
          (FluxTrackBuilder *this,CylHead *cylhead,DataRate datarate,Encoding encoding)

{
  uint32_t uVar1;
  
  TrackBuilder::TrackBuilder(&this->super_TrackBuilder,datarate,encoding);
  (this->super_TrackBuilder)._vptr_TrackBuilder = (_func_int **)&PTR__FluxTrackBuilder_001dc220;
  *(CylHead *)&(this->super_TrackBuilder).field_0x14 = *cylhead;
  (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_flux_times).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)datarate < 500000) {
    if (datarate == _250K) {
      uVar1 = 2000;
      goto LAB_0015d937;
    }
    if (datarate == _300K) {
      uVar1 = 0x683;
      goto LAB_0015d937;
    }
  }
  else {
    if (datarate == _500K) {
      uVar1 = 1000;
      goto LAB_0015d937;
    }
    if (datarate == _1M) {
      uVar1 = 500;
      goto LAB_0015d937;
    }
  }
  uVar1 = 0;
LAB_0015d937:
  this->m_bitcell_ns = uVar1;
  this->m_flux_time = -uVar1;
  this->m_last_bit = false;
  this->m_curr_bit = false;
  return;
}

Assistant:

FluxTrackBuilder::FluxTrackBuilder(const CylHead& cylhead, DataRate datarate, Encoding encoding)
    : TrackBuilder(datarate, encoding),
    m_cylhead(cylhead), m_bitcell_ns(bitcell_ns(datarate)),
    m_flux_time(0U - m_bitcell_ns)
{
    // We start with a negative cell time to absorb the first zero m_cur_bit.
    // This ensures the first reversal exactly matches the added data.
}